

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O1

void pgraph_load_pipe(int cnum,uint32_t addr,uint32_t *data,int num)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  pvVar1 = nva_cards[cnum]->bar0;
  *(uint32_t *)((long)pvVar1 + 0x400f50) = addr;
  if (0 < num) {
    uVar3 = 0;
    do {
      *(uint32_t *)((long)pvVar1 + 0x400f54) = data[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)num != uVar3);
  }
  pvVar1 = nva_cards[cnum]->bar0;
  if (*(int *)((long)pvVar1 + 0x400700) != 0) {
    iVar2 = 9999;
    do {
      bVar4 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if (bVar4) {
        printf("PIPE write hang on %04x: %08x\n",addr,(ulong)*(uint *)((long)pvVar1 + 0x400700));
      }
      pvVar1 = nva_cards[cnum]->bar0;
    } while (*(int *)((long)pvVar1 + 0x400700) != 0);
  }
  return;
}

Assistant:

void pgraph_load_pipe(int cnum, uint32_t addr, uint32_t *data, int num) {
	nva_wr32(cnum, 0x400f50, addr);
	for (int i = 0; i < num; i++)
		nva_wr32(cnum, 0x400f54, data[i]);
	int ctr = 0;
	while (nva_rd32(cnum, 0x400700)) {
		ctr++;
		if (ctr == 10000) {
			printf("PIPE write hang on %04x: %08x\n", addr, nva_rd32(cnum, 0x400700));
		}
	}
}